

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

iterator __thiscall
google::protobuf::RepeatedField<bool>::erase(RepeatedField<bool> *this,const_iterator position)

{
  void *__dest;
  void *pvVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  
  pvVar1 = this->arena_or_elements_;
  iVar2 = this->current_size_;
  lVar3 = (long)((int)position - (int)pvVar1);
  __dest = (void *)((long)pvVar1 + lVar3);
  __n = (long)pvVar1 + ((long)iVar2 - (long)(position + 1));
  if (__n != 0) {
    memmove(__dest,position + 1,__n);
    iVar2 = this->current_size_;
    pvVar1 = this->arena_or_elements_;
  }
  if (0 < iVar2) {
    this->current_size_ = ((int)__dest + (int)__n) - (int)pvVar1;
  }
  return (iterator)((long)pvVar1 + lVar3);
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator position) {
  return erase(position, position + 1);
}